

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O1

void google::DemangleInplace(char *out,int out_size)

{
  bool bVar1;
  size_t sVar2;
  char demangled [256];
  char acStack_118 [264];
  
  bVar1 = Demangle(out,acStack_118,0x100);
  if (bVar1) {
    sVar2 = strlen(acStack_118);
    if (sVar2 + 1 <= (ulong)(long)out_size) {
      if (0xff < sVar2) {
        abort();
      }
      memcpy(out,acStack_118,sVar2 + 1);
    }
  }
  return;
}

Assistant:

static ATTRIBUTE_NOINLINE void DemangleInplace(char *out, int out_size) {
  char demangled[256];  // Big enough for sane demangled symbols.
  if (Demangle(out, demangled, sizeof(demangled))) {
    // Demangling succeeded. Copy to out if the space allows.
    size_t len = strlen(demangled);
    if (len + 1 <= (size_t)out_size) {  // +1 for '\0'.
      SAFE_ASSERT(len < sizeof(demangled));
      memmove(out, demangled, len + 1);
    }
  }
}